

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

UMutableCPTrie * umutablecptrie_fromUCPMap_63(UCPMap *map,UErrorCode *pErrorCode)

{
  uint32_t errValue;
  uint32_t iniValue;
  UChar32 end;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> this;
  MutableCodePointTrie *p;
  size_t size;
  int start;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> mutableTrie;
  uint32_t local_34;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  if (map == (UCPMap *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UMutableCPTrie *)0x0;
  }
  errValue = ucpmap_get_63(map,-1);
  size = 0x10ffff;
  iniValue = ucpmap_get_63(map,0x10ffff);
  this.ptr = (MutableCodePointTrie *)icu_63::UMemory::operator_new((UMemory *)0x11040,size);
  if (this.ptr != (MutableCodePointTrie *)0x0) {
    icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
              (this.ptr,iniValue,errValue,pErrorCode);
  }
  mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr =
       (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)
       (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)this.ptr;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR && this.ptr == (MutableCodePointTrie *)0x0) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    start = 0;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      while (end = ucpmap_getRange_63(map,start,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                      (void *)0x0,&local_34), -1 < end) {
        if (local_34 != iniValue) {
          if (start == end) {
            icu_63::anon_unknown_0::MutableCodePointTrie::set(this.ptr,start,local_34,pErrorCode);
          }
          else {
            icu_63::anon_unknown_0::MutableCodePointTrie::setRange
                      (this.ptr,start,end,local_34,pErrorCode);
          }
        }
        start = end + 1;
      }
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        mutableTrie.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr
             = (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)
               (MutableCodePointTrie *)0x0;
        goto LAB_002a4730;
      }
    }
  }
  this.ptr = (MutableCodePointTrie *)0x0;
LAB_002a4730:
  icu_63::LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
            (&mutableTrie);
  return (UMutableCPTrie *)this.ptr;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}